

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ssize_t __thiscall kj::InputStream::read(InputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t minBytes_local;
  size_t n;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  Fault f;
  ArrayPtr<unsigned_char> local_30;
  size_t sVar2;
  
  minBytes_local = __nbytes;
  iVar1 = (*this->_vptr_InputStream[2])();
  sVar2 = CONCAT44(extraout_var,iVar1);
  _kjCondition.left = &n;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = __nbytes <= sVar2;
  if (!_kjCondition.result) {
    n = sVar2;
    _kjCondition.right = &minBytes_local;
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[14]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
               ,0x35,FAILED,"n >= minBytes","_kjCondition,\"Premature EOF\"",&_kjCondition,
               (char (*) [14])"Premature EOF");
    local_30.ptr = (uchar *)(CONCAT44(in_register_00000034,__fd) + n);
    local_30.size_ = minBytes_local - n;
    ArrayPtr<unsigned_char>::fill(&local_30,'\0');
    sVar2 = minBytes_local;
    _::Debug::Fault::~Fault(&f);
  }
  return sVar2;
}

Assistant:

size_t InputStream::read(ArrayPtr<byte> buffer, size_t minBytes) {
  size_t n = tryRead(buffer, minBytes);
  KJ_REQUIRE(n >= minBytes, "Premature EOF") {
    // Pretend we read zeros from the input.
    buffer.slice(n).first(minBytes-n).fill(0);
    return minBytes;
  }
  return n;
}